

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_decode_from_hex_odd_Test::TestBody
          (HexEncoderTest_test_decode_from_hex_odd_Test *this)

{
  reference pvVar1;
  char *pcVar2;
  allocator<char> local_d9;
  AssertHelper local_d8;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  
  local_d8.data_._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_28,"0",&local_d9);
  bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,0);
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&gtest_ar,"(unsigned char) 0","HexEncoder::DecodeFromHex(\"0\").at(0)",
             (uchar *)&local_d8,pvVar1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  std::__cxx11::string::~string(local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_d8.data_._0_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_48,"17f",&local_d9);
    bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0);
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,0);
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
              ((internal *)&gtest_ar,"(unsigned char) 1","HexEncoder::DecodeFromHex(\"17f\").at(0)",
               (uchar *)&local_d8,pvVar1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
    std::__cxx11::string::~string(local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x38,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_d8.data_._0_1_ = 0x7f;
      std::__cxx11::string::string<std::allocator<char>>(local_68,"17f",&local_d9);
      bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0,local_68);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,1);
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&gtest_ar,"(unsigned char) 127",
                 "HexEncoder::DecodeFromHex(\"17f\").at(1)",(uchar *)&local_d8,pvVar1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
      std::__cxx11::string::~string(local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x39,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_d8.data_._0_1_ = 2;
        std::__cxx11::string::string<std::allocator<char>>(local_88,"280",&local_d9);
        bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0);
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,0);
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&gtest_ar,"(unsigned char) 2",
                   "HexEncoder::DecodeFromHex(\"280\").at(0)",(uchar *)&local_d8,pvVar1);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
        std::__cxx11::string::~string(local_88);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_d8.data_._0_1_ = 0x80;
          std::__cxx11::string::string<std::allocator<char>>(local_a8,"280",&local_d9);
          bidfx_public_api::tools::HexEncoder::DecodeFromHex(&local_c0,local_a8);
          pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,1);
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    ((internal *)&gtest_ar,"(unsigned char) -128",
                     "HexEncoder::DecodeFromHex(\"280\").at(1)",(uchar *)&local_d8,pvVar1);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0)
          ;
          std::__cxx11::string::~string(local_a8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_c0);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x3b,pcVar2);
            testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper(&local_d8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_c0);
          }
          goto LAB_0018384d;
        }
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x3a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_c0);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0);
LAB_0018384d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HexEncoderTest, test_decode_from_hex_odd)
{
    ASSERT_EQ((unsigned char) 0, HexEncoder::DecodeFromHex("0").at(0));
    ASSERT_EQ((unsigned char) 1, HexEncoder::DecodeFromHex("17f").at(0));
    ASSERT_EQ((unsigned char) 127, HexEncoder::DecodeFromHex("17f").at(1));
    ASSERT_EQ((unsigned char) 2, HexEncoder::DecodeFromHex("280").at(0));
    ASSERT_EQ((unsigned char) -128, HexEncoder::DecodeFromHex("280").at(1));
}